

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

void __thiscall
StatusPrinter::BuildEdgeStarted(StatusPrinter *this,Edge *edge,int64_t start_time_millis)

{
  bool bVar1;
  
  this->started_edges_ = this->started_edges_ + 1;
  this->running_edges_ = this->running_edges_ + 1;
  this->time_millis_ = start_time_millis;
  bVar1 = Edge::use_console(edge);
  if ((bVar1) || ((this->printer_).smart_terminal_ == true)) {
    PrintStatus(this,edge,start_time_millis);
  }
  bVar1 = Edge::use_console(edge);
  if (bVar1) {
    LinePrinter::SetConsoleLocked(&this->printer_,true);
    return;
  }
  return;
}

Assistant:

void StatusPrinter::BuildEdgeStarted(const Edge* edge,
                                     int64_t start_time_millis) {
  ++started_edges_;
  ++running_edges_;
  time_millis_ = start_time_millis;

  if (edge->use_console() || printer_.is_smart_terminal())
    PrintStatus(edge, start_time_millis);

  if (edge->use_console())
    printer_.SetConsoleLocked(true);
}